

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameWithClusterInfo.cpp
# Opt level: O1

string * __thiscall
BayesianGameWithClusterInfo::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,BayesianGameWithClusterInfo *this,
          BGClusterAlgorithm clusterAlg)

{
  E *this_00;
  undefined4 in_register_00000014;
  char *pcVar1;
  char *pcVar2;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Lossless";
    pcVar1 = "";
    break;
  case 1:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "ApproxJB";
    pcVar1 = "";
    break;
  case 2:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "ApproxPjaoh";
    pcVar1 = "";
    break;
  case 3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "ApproxPjaohJB";
    pcVar1 = "";
    break;
  default:
    this_00 = (E *)__cxa_allocate_exception(0x28,this,CONCAT44(in_register_00000014,clusterAlg));
    E::E(this_00,"BayesianGameWithClusterInfo::SoftPrint BGClusterAlgorithm not handled");
    __cxa_throw(this_00,&E::typeinfo,E::~E);
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

string BayesianGameWithClusterInfo::SoftPrint(BGClusterAlgorithm clusterAlg)
{
    switch(clusterAlg)
    {
    case Lossless:
        return("Lossless");
    case ApproxJB:
        return("ApproxJB");
    case ApproxPjaoh:
        return("ApproxPjaoh");
    case ApproxPjaohJB:
        return("ApproxPjaohJB");
    }

    throw(E("BayesianGameWithClusterInfo::SoftPrint BGClusterAlgorithm not handled"));
    return("");
}